

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::parse_ubjson_internal
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this,bool get_char)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  byte *pbVar4;
  size_t sVar5;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,get_char) == 0) {
    bVar3 = get_ubjson_value(this,this->current);
    return bVar3;
  }
  pbVar4 = (byte *)(this->ia).current;
  pbVar2 = (byte *)(this->ia).end;
  sVar5 = this->chars_read;
  do {
    sVar5 = sVar5 + 1;
    this->chars_read = sVar5;
    if (pbVar4 == pbVar2) {
      this->current = -1;
      bVar3 = get_ubjson_value(this,-1);
      return bVar3;
    }
    bVar1 = *pbVar4;
    pbVar4 = pbVar4 + 1;
    (this->ia).current = (char *)pbVar4;
    this->current = (uint)bVar1;
  } while (bVar1 == 0x4e);
  bVar3 = get_ubjson_value(this,(uint)bVar1);
  return bVar3;
}

Assistant:

bool parse_ubjson_internal(const bool get_char = true)
    {
        return get_ubjson_value(get_char ? get_ignore_noop() : current);
    }